

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver.hpp
# Opt level: O2

results_type * __thiscall
asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::resolve
          (results_type *__return_storage_ptr__,
          basic_resolver<asio::ip::udp,_asio::any_io_executor> *this,query *q)

{
  error_code ec;
  error_code local_30;
  
  local_30._M_value = 0;
  local_30._M_cat = (error_category *)std::_V2::system_category();
  asio::detail::resolver_service<asio::ip::udp>::resolve
            (__return_storage_ptr__,(this->impl_).service_,&(this->impl_).implementation_,q,
             &local_30);
  asio::detail::throw_error(&local_30,"resolve");
  return __return_storage_ptr__;
}

Assistant:

results_type resolve(const query& q)
  {
    asio::error_code ec;
    results_type r = impl_.get_service().resolve(
        impl_.get_implementation(), q, ec);
    asio::detail::throw_error(ec, "resolve");
    return r;
  }